

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O1

double __thiscall chrono::robosimian::RS_Limb::GetMass(RS_Limb *this)

{
  _Hash_node_base *p_Var1;
  value_type link;
  double local_50;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>
  local_48;
  
  p_Var1 = (this->m_links)._M_h._M_before_begin._M_nxt;
  if (p_Var1 == (_Hash_node_base *)0x0) {
    local_50 = 0.0;
  }
  else {
    local_50 = 0.0;
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>
      ::pair(&local_48,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>
              *)(p_Var1 + 1));
      local_50 = local_50 +
                 *(double *)
                  (((local_48.second.
                     super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_body).
                   super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                  0x2e8);
      if (local_48.second.
          super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.second.
                   super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48.first._M_dataplus._M_p != &local_48.first.field_2) {
        operator_delete(local_48.first._M_dataplus._M_p,
                        local_48.first.field_2._M_allocated_capacity + 1);
      }
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  return local_50;
}

Assistant:

double RS_Limb::GetMass() const {
    double mass = 0;
    for (auto link : m_links)
        mass += link.second->m_body->GetMass();
    return mass;
}